

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O2

ValueType * __thiscall
HighsHashTree<int,_HighsImplications::VarBound>::InnerLeaf<2>::find_entry
          (InnerLeaf<2> *this,uint64_t fullHash,int hashPos,int *key)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  ValueType *pVVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  uint16_t hash;
  uint16_t local_16;
  int local_14;
  
  uVar8 = fullHash >> ((char)hashPos * -6 + 0x30U & 0x3f);
  uVar2 = uVar8 >> 10;
  uVar1 = (this->occupation).occupation;
  if ((uVar1 >> (uVar2 & 0x3f) & 1) == 0) {
    pVVar5 = (ValueType *)0x0;
  }
  else {
    lVar6 = POPCOUNT(uVar1 >> ((byte)uVar2 & 0x3f));
    do {
      lVar7 = lVar6 + 1;
      lVar3 = lVar6 + -1;
      lVar6 = lVar7;
    } while ((uVar8 & 0xffff) < (this->hashes)._M_elems[lVar3]);
    local_14 = (int)lVar7 + -2;
    bVar4 = find_key(this,key,&local_16,&local_14);
    pVVar5 = (ValueType *)0x0;
    if (bVar4) {
      pVVar5 = &(this->entries)._M_elems[local_14].value_;
    }
  }
  return pVVar5;
}

Assistant:

ValueType* find_entry(uint64_t fullHash, int hashPos, const K& key) {
      uint16_t hash = get_hash_chunks16(fullHash, hashPos);
      uint8_t hashChunk = get_first_chunk16(hash);
      if (!occupation.test(hashChunk)) return nullptr;

      int pos = occupation.num_set_until(hashChunk) - 1;
      while (hashes[pos] > hash) ++pos;

      if (find_key(key, hash, pos)) return &entries[pos].value();

      return nullptr;
    }